

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O3

Info * __thiscall
re2::Regexp::Walker<re2::Prefilter::Info_*>::WalkInternal
          (Walker<re2::Prefilter::Info_*> *this,Regexp *re,Info *top_arg,bool use_copy)

{
  ushort uVar1;
  deque<re2::WalkState<re2::Prefilter::Info*>,std::allocator<re2::WalkState<re2::Prefilter::Info*>>>
  *pdVar2;
  undefined8 *puVar3;
  stack<re2::WalkState<re2::Prefilter::Info_*>,_std::deque<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>_>
  *psVar4;
  _Map_pointer ppWVar5;
  WalkState<re2::Prefilter::Info_*> *pWVar6;
  long *plVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  WalkState<re2::Prefilter::Info_*> *pWVar11;
  Info **ppIVar12;
  Regexp *pRVar13;
  _Elt_pointer pWVar14;
  ulong uVar15;
  bool stop;
  undefined1 local_1b0 [24];
  Info *pIStack_198;
  Info *local_190;
  Info **ppIStack_188;
  
  Reset(this);
  if (re == (Regexp *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/walker-inl.h",
               0xa0,3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),"Walk NULL",9);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
  }
  else {
    pdVar2 = (deque<re2::WalkState<re2::Prefilter::Info*>,std::allocator<re2::WalkState<re2::Prefilter::Info*>>>
              *)this->stack_;
    local_1b0._8_4_ = -1;
    ppIStack_188 = (Info **)0x0;
    puVar3 = *(undefined8 **)(pdVar2 + 0x30);
    local_1b0._0_8_ = re;
    local_1b0._16_8_ = top_arg;
    if (puVar3 == (undefined8 *)(*(long *)(pdVar2 + 0x40) + -0x30)) {
      std::
      deque<re2::WalkState<re2::Prefilter::Info*>,std::allocator<re2::WalkState<re2::Prefilter::Info*>>>
      ::_M_push_back_aux<re2::WalkState<re2::Prefilter::Info*>>
                (pdVar2,(WalkState<re2::Prefilter::Info_*> *)local_1b0);
    }
    else {
      puVar3[4] = local_190;
      puVar3[5] = 0;
      puVar3[2] = top_arg;
      puVar3[3] = pIStack_198;
      *puVar3 = re;
      puVar3[1] = CONCAT44(local_1b0._12_4_,0xffffffff);
      *(long *)(pdVar2 + 0x30) = *(long *)(pdVar2 + 0x30) + 0x30;
    }
LAB_0011ef77:
    while( true ) {
      psVar4 = this->stack_;
      pWVar14 = (psVar4->c).
                super__Deque_base<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pWVar14 ==
          (psVar4->c).
          super__Deque_base<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar14 = (psVar4->c).
                  super__Deque_base<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
      }
      pRVar13 = pWVar14[-1].re;
      uVar15 = (ulong)(uint)pWVar14[-1].n;
      if (pWVar14[-1].n == 0xffffffff) break;
LAB_0011efa3:
      uVar1 = pRVar13->nsub_;
      if (uVar1 == 0) {
LAB_0011f080:
        iVar9 = (*this->_vptr_Walker[3])
                          (this,pRVar13,pWVar14[-1].parent_arg,pWVar14[-1].pre_arg,
                           pWVar14[-1].child_args);
        top_arg = (Info *)CONCAT44(extraout_var_01,iVar9);
        if ((1 < pRVar13->nsub_) && (pWVar14[-1].child_args != (Info **)0x0)) {
          operator_delete__(pWVar14[-1].child_args);
        }
        goto LAB_0011f0cb;
      }
      if (uVar1 == 1) {
        paVar10 = &pRVar13->field_5;
      }
      else {
        paVar10 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar13->field_5).submany_;
      }
      iVar9 = (int)uVar15;
      if ((int)(uint)uVar1 <= iVar9) goto LAB_0011f080;
      if (use_copy && 0 < iVar9) {
        pRVar13 = (Regexp *)paVar10[uVar15].submany_;
        if ((Regexp *)paVar10[iVar9 - 1U].submany_ != pRVar13) goto LAB_0011f162;
        iVar8 = (*this->_vptr_Walker[4])(this,pWVar14[-1].child_args[iVar9 - 1U]);
        iVar9 = pWVar14[-1].n;
        pWVar14[-1].child_args[iVar9] = (Info *)CONCAT44(extraout_var_00,iVar8);
        pWVar14[-1].n = iVar9 + 1;
      }
      else {
        pRVar13 = (Regexp *)paVar10[iVar9].submany_;
LAB_0011f162:
        pdVar2 = (deque<re2::WalkState<re2::Prefilter::Info*>,std::allocator<re2::WalkState<re2::Prefilter::Info*>>>
                  *)this->stack_;
        local_1b0._16_8_ = pWVar14[-1].pre_arg;
        local_1b0._8_4_ = -1;
        ppIStack_188 = (Info **)0x0;
        plVar7 = *(long **)(pdVar2 + 0x30);
        local_1b0._0_8_ = pRVar13;
        if (plVar7 == (long *)(*(long *)(pdVar2 + 0x40) + -0x30)) {
          std::
          deque<re2::WalkState<re2::Prefilter::Info*>,std::allocator<re2::WalkState<re2::Prefilter::Info*>>>
          ::_M_push_back_aux<re2::WalkState<re2::Prefilter::Info*>>
                    (pdVar2,(WalkState<re2::Prefilter::Info_*> *)local_1b0);
        }
        else {
          plVar7[4] = (long)local_190;
          plVar7[5] = 0;
          plVar7[2] = local_1b0._16_8_;
          plVar7[3] = (long)pIStack_198;
          *plVar7 = (long)pRVar13;
          plVar7[1] = CONCAT44(local_1b0._12_4_,0xffffffff);
          *(long *)(pdVar2 + 0x30) = *(long *)(pdVar2 + 0x30) + 0x30;
        }
      }
    }
    iVar9 = this->max_visits_;
    this->max_visits_ = iVar9 + -1;
    if (iVar9 < 1) {
      this->stopped_early_ = true;
      iVar9 = (*this->_vptr_Walker[5])(this,pRVar13,pWVar14[-1].parent_arg);
      top_arg = (Info *)CONCAT44(extraout_var_02,iVar9);
    }
    else {
      local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
      iVar9 = (*this->_vptr_Walker[2])(this,pRVar13,pWVar14[-1].parent_arg,local_1b0);
      top_arg = (Info *)CONCAT44(extraout_var,iVar9);
      pWVar14[-1].pre_arg = top_arg;
      if (local_1b0[0] == '\0') {
        pWVar14[-1].n = 0;
        pWVar14[-1].child_args = (Info **)0x0;
        uVar1 = pRVar13->nsub_;
        uVar15 = (ulong)uVar1;
        if (uVar1 != 0) {
          if (uVar1 == 1) {
            pWVar14[-1].child_args = &pWVar14[-1].child_arg;
            uVar15 = 0;
          }
          else {
            ppIVar12 = (Info **)operator_new__((ulong)uVar1 << 3);
            pWVar14[-1].child_args = ppIVar12;
            uVar15 = (ulong)(uint)pWVar14[-1].n;
          }
        }
        goto LAB_0011efa3;
      }
    }
LAB_0011f0cb:
    std::
    deque<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>
    ::pop_back(&this->stack_->c);
    psVar4 = this->stack_;
    ppWVar5 = (psVar4->c).
              super__Deque_base<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    pWVar11 = (psVar4->c).
              super__Deque_base<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    pWVar6 = (psVar4->c).
             super__Deque_base<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
    if (((long)pWVar11 - (long)pWVar6 >> 4) * -0x5555555555555555 +
        (((long)ppWVar5 -
          (long)(psVar4->c).
                super__Deque_base<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
        (ulong)(ppWVar5 == (_Map_pointer)0x0)) * 10 !=
        ((long)(psVar4->c).
               super__Deque_base<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last -
         (long)(psVar4->c).
               super__Deque_base<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) * 0x5555555555555555) {
      if (pWVar11 == pWVar6) {
        pWVar11 = ppWVar5[-1] + 10;
      }
      if (pWVar11[-1].child_args == (Info **)0x0) {
        pWVar11[-1].child_arg = top_arg;
        iVar9 = pWVar11[-1].n;
      }
      else {
        iVar9 = pWVar11[-1].n;
        pWVar11[-1].child_args[iVar9] = top_arg;
      }
      pWVar11[-1].n = iVar9 + 1;
      goto LAB_0011ef77;
    }
  }
  return top_arg;
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_->push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_->top();
    Regexp* re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        // Fall through.
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_->push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_->top().
    // Update next guy down.
    stack_->pop();
    if (stack_->size() == 0)
      return t;
    s = &stack_->top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}